

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

char * skip_quoted(char **buf,char *delimiters,char *whitespace,char quotechar)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  char *__src;
  
  __s = *buf;
  sVar1 = strcspn(__s,delimiters);
  __src = __s + sVar1;
  if (0 < (long)sVar1) {
    pcVar2 = __src + -1;
    while( true ) {
      if (*pcVar2 != (char)whitespace) goto LAB_00124909;
      if (*__src == '\0') break;
      sVar1 = strcspn(__src + 1,delimiters);
      memmove(pcVar2,__src,sVar1 + 1);
      pcVar2 = pcVar2 + sVar1;
      __src = __src + sVar1 + 1;
    }
    do {
      *pcVar2 = '\0';
LAB_00124909:
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 < __src);
  }
  pcVar2 = __src;
  if (*__src != '\0') {
    sVar1 = strspn(__src + 1," ");
    pcVar2 = __src + sVar1 + 1;
    for (; __src < pcVar2; __src = __src + 1) {
      *__src = '\0';
    }
  }
  *buf = pcVar2;
  return __s;
}

Assistant:

static char *
skip_quoted(char **buf,
            const char *delimiters,
            const char *whitespace,
            char quotechar)
{
	char *p, *begin_word, *end_word, *end_whitespace;

	begin_word = *buf;
	end_word = begin_word + strcspn(begin_word, delimiters);

	/* Check for quotechar */
	if (end_word > begin_word) {
		p = end_word - 1;
		while (*p == quotechar) {
			/* While the delimiter is quoted, look for the next delimiter. */
			/* This happens, e.g., in calls from parse_auth_header,
			 * if the user name contains a " character. */

			/* If there is anything beyond end_word, copy it. */
			if (*end_word != '\0') {
				size_t end_off = strcspn(end_word + 1, delimiters);
				memmove(p, end_word, end_off + 1);
				p += end_off; /* p must correspond to end_word - 1 */
				end_word += end_off + 1;
			} else {
				*p = '\0';
				break;
			}
		}
		for (p++; p < end_word; p++) {
			*p = '\0';
		}
	}

	if (*end_word == '\0') {
		*buf = end_word;
	} else {

#if defined(GCC_DIAGNOSTIC)
		/* Disable spurious conversion warning for GCC */
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif /* defined(GCC_DIAGNOSTIC) */

		end_whitespace = end_word + strspn(&end_word[1], whitespace) + 1;

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic pop
#endif /* defined(GCC_DIAGNOSTIC) */

		for (p = end_word; p < end_whitespace; p++) {
			*p = '\0';
		}

		*buf = end_whitespace;
	}

	return begin_word;
}